

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

void __thiscall cmFileAPI::cmFileAPI(cmFileAPI *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  CharReader *pCVar2;
  StreamWriter *pSVar3;
  string *__lhs;
  Value *pVVar4;
  CharReader *pCVar5;
  StreamWriter *pSVar6;
  allocator<char> local_e1;
  Value local_e0;
  StreamWriterBuilder wbuilder;
  String local_80;
  CharReaderBuilder rbuilder;
  
  this->CMakeInstance = cm;
  (this->APIv1)._M_dataplus._M_p = (pointer)&(this->APIv1).field_2;
  (this->APIv1)._M_string_length = 0;
  (this->APIv1).field_2._M_local_buf[0] = '\0';
  (this->ReplyFiles)._M_h._M_buckets = &(this->ReplyFiles)._M_h._M_single_bucket;
  (this->ReplyFiles)._M_h._M_bucket_count = 1;
  (this->ReplyFiles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ReplyFiles)._M_h._M_element_count = 0;
  (this->ReplyFiles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->TopQuery).Known.super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TopQuery).Known.super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TopQuery).Known.super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TopQuery).Unknown.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TopQuery).Unknown.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TopQuery).Unknown.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ClientQueries)._M_t._M_impl.super__Rb_tree_header;
  (this->ReplyFiles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ReplyFiles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->QueryExists = false;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->JsonReader)._M_t.
  super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
  super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl = (CharReader *)0x0;
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = (StreamWriter *)0x0;
  __lhs = cmake::GetHomeOutputDirectory_abi_cxx11_(cm);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rbuilder,
                 __lhs,"/.cmake/api/v1");
  std::__cxx11::string::operator=((string *)&this->APIv1,(string *)&rbuilder);
  std::__cxx11::string::~string((string *)&rbuilder);
  Json::CharReaderBuilder::CharReaderBuilder(&rbuilder);
  Json::Value::Value((Value *)&wbuilder,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"collectComments",(allocator<char> *)&local_80);
  pVVar4 = Json::CharReaderBuilder::operator[](&rbuilder,(String *)&local_e0);
  Json::Value::operator=(pVVar4,(Value *)&wbuilder);
  std::__cxx11::string::~string((string *)&local_e0);
  Json::Value::~Value((Value *)&wbuilder);
  Json::Value::Value((Value *)&wbuilder,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"failIfExtra",(allocator<char> *)&local_80);
  pVVar4 = Json::CharReaderBuilder::operator[](&rbuilder,(String *)&local_e0);
  Json::Value::operator=(pVVar4,(Value *)&wbuilder);
  std::__cxx11::string::~string((string *)&local_e0);
  Json::Value::~Value((Value *)&wbuilder);
  Json::Value::Value((Value *)&wbuilder,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"rejectDupKeys",(allocator<char> *)&local_80);
  pVVar4 = Json::CharReaderBuilder::operator[](&rbuilder,(String *)&local_e0);
  Json::Value::operator=(pVVar4,(Value *)&wbuilder);
  std::__cxx11::string::~string((string *)&local_e0);
  Json::Value::~Value((Value *)&wbuilder);
  Json::Value::Value((Value *)&wbuilder,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"strictRoot",(allocator<char> *)&local_80);
  pVVar4 = Json::CharReaderBuilder::operator[](&rbuilder,(String *)&local_e0);
  Json::Value::operator=(pVVar4,(Value *)&wbuilder);
  std::__cxx11::string::~string((string *)&local_e0);
  Json::Value::~Value((Value *)&wbuilder);
  pCVar5 = Json::CharReaderBuilder::newCharReader(&rbuilder);
  pCVar2 = (this->JsonReader)._M_t.
           super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
           super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
           super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl;
  (this->JsonReader)._M_t.
  super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
  super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl = pCVar5;
  if (pCVar2 != (CharReader *)0x0) {
    (*pCVar2->_vptr_CharReader[1])();
  }
  Json::StreamWriterBuilder::StreamWriterBuilder(&wbuilder);
  Json::Value::Value(&local_e0,"\t");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"indentation",&local_e1);
  pVVar4 = Json::StreamWriterBuilder::operator[](&wbuilder,&local_80);
  Json::Value::operator=(pVVar4,&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  Json::Value::~Value(&local_e0);
  pSVar6 = Json::StreamWriterBuilder::newStreamWriter(&wbuilder);
  pSVar3 = (this->JsonWriter)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = pSVar6;
  if (pSVar3 != (StreamWriter *)0x0) {
    (*pSVar3->_vptr_StreamWriter[1])();
  }
  Json::StreamWriterBuilder::~StreamWriterBuilder(&wbuilder);
  Json::CharReaderBuilder::~CharReaderBuilder(&rbuilder);
  return;
}

Assistant:

cmFileAPI::cmFileAPI(cmake* cm)
  : CMakeInstance(cm)
{
  this->APIv1 =
    this->CMakeInstance->GetHomeOutputDirectory() + "/.cmake/api/v1";

  Json::CharReaderBuilder rbuilder;
  rbuilder["collectComments"] = false;
  rbuilder["failIfExtra"] = true;
  rbuilder["rejectDupKeys"] = false;
  rbuilder["strictRoot"] = true;
  this->JsonReader =
    std::unique_ptr<Json::CharReader>(rbuilder.newCharReader());

  Json::StreamWriterBuilder wbuilder;
  wbuilder["indentation"] = "\t";
  this->JsonWriter =
    std::unique_ptr<Json::StreamWriter>(wbuilder.newStreamWriter());
}